

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

uint __thiscall
QFragmentMapData<QTextBlockData>::maximum(QFragmentMapData<QTextBlockData> *this,uint n)

{
  QTextBlockData *pQVar1;
  uint in_ESI;
  QFragmentMapData<QTextBlockData> *in_RDI;
  bool bVar2;
  uint local_c;
  
  local_c = in_ESI;
  while( true ) {
    bVar2 = false;
    if (local_c != 0) {
      pQVar1 = fragment(in_RDI,local_c);
      bVar2 = (pQVar1->super_QFragment<3>).right != 0;
    }
    if (!bVar2) break;
    pQVar1 = fragment(in_RDI,local_c);
    local_c = (pQVar1->super_QFragment<3>).right;
  }
  return local_c;
}

Assistant:

uint maximum(uint n) const {
        while (n && fragment(n)->right)
            n = fragment(n)->right;
        return n;
    }